

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed>
::operator=(SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed>
            *this,SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed>
                  *RHS)

{
  void *pvVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 *puVar6;
  ulong uVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong MinSize;
  undefined4 *puVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 *puVar13;
  
  if (this == RHS) {
    return this;
  }
  puVar10 = (undefined4 *)
            (RHS->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
            ).
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_void>
            .super_SmallVectorBase.BeginX;
  pvVar1 = (RHS->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  uVar12 = (long)pvVar1 - (long)puVar10;
  MinSize = ((long)uVar12 >> 3) * -0x5555555555555555;
  puVar13 = (undefined4 *)
            (this->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
            ).
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_void>
            .super_SmallVectorBase.BeginX;
  puVar2 = (undefined4 *)
           (this->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  uVar7 = (long)puVar2 - (long)puVar13;
  uVar11 = ((long)uVar7 >> 3) * -0x5555555555555555;
  if (MinSize <= uVar11) {
    uVar7 = (long)pvVar1 - (long)puVar10;
    if ((uVar7 != 0) && (0 < (long)uVar7)) {
      lVar5 = uVar7 / 0x18 + 1;
      do {
        *puVar13 = *puVar10;
        *(undefined8 *)(puVar13 + 2) = *(undefined8 *)(puVar10 + 2);
        *(undefined8 *)(puVar13 + 4) = *(undefined8 *)(puVar10 + 4);
        puVar10 = puVar10 + 6;
        puVar13 = puVar13 + 6;
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    goto LAB_0049137f;
  }
  if ((ulong)((long)(this->
                    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_void>
                    .super_SmallVectorBase.CapacityX - (long)puVar13) < uVar12) {
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX = puVar13;
    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
    ::grow(&this->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
           ,MinSize);
LAB_00491341:
    uVar11 = 0;
  }
  else {
    if (puVar2 == puVar13) goto LAB_00491341;
    if (0 < (long)uVar7) {
      lVar9 = uVar7 / 0x18 + 1;
      lVar5 = 0;
      do {
        *(undefined4 *)((long)puVar13 + lVar5) = *(undefined4 *)((long)puVar10 + lVar5);
        *(undefined8 *)((long)puVar13 + lVar5 + 8) = *(undefined8 *)((long)puVar10 + lVar5 + 8);
        *(undefined8 *)((long)puVar13 + lVar5 + 0x10) =
             *(undefined8 *)((long)puVar10 + lVar5 + 0x10);
        lVar9 = lVar9 + -1;
        lVar5 = lVar5 + 0x18;
      } while (1 < lVar9);
    }
  }
  puVar8 = (undefined8 *)
           ((long)(RHS->
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
                  ).
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_void>
                  .super_SmallVectorBase.BeginX + uVar11 * 0x18);
  puVar3 = (undefined8 *)
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  if (puVar8 != puVar3) {
    puVar6 = (undefined8 *)
             (uVar11 * 0x18 +
             (long)(this->
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
                   ).
                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_void>
                   .super_SmallVectorBase.BeginX);
    do {
      puVar6[2] = puVar8[2];
      uVar4 = puVar8[1];
      *puVar6 = *puVar8;
      puVar6[1] = uVar4;
      puVar8 = puVar8 + 3;
      puVar6 = puVar6 + 3;
    } while (puVar8 != puVar3);
  }
  puVar13 = (undefined4 *)
            (uVar12 + (long)(this->
                            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
                            ).
                            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_void>
                            .super_SmallVectorBase.BeginX);
LAB_0049137f:
  (this->
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_false>
  ).
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX = puVar13;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}